

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void ot::commissioner::utils::Encode<unsigned_short>(ByteArray *aBuf,unsigned_short aInteger)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)aInteger;
  uVar3 = (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(aBuf,uVar3 + 2);
  for (uVar1 = (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start; uVar3 < uVar1; uVar1 = uVar1 - 1) {
    (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar1 - 1] = (uchar)uVar2;
    uVar2 = uVar2 >> 8;
  }
  return;
}

Assistant:

void Encode(ByteArray &aBuf, T aInteger)
{
    auto length = aBuf.size();
    aBuf.resize(length + sizeof(T));
    for (size_t i = aBuf.size(); i > length; --i)
    {
        aBuf[i - 1] = aInteger & 0xFF;
        aInteger >>= 8;
    }
}